

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

bool Random_SanityCheck(void)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined1 auVar3 [13];
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  uint5 uVar19;
  undefined1 auVar20 [13];
  long lVar21;
  undefined4 extraout_var;
  int *piVar22;
  RNGState *this;
  ulong uVar23;
  uint uVar24;
  long in_FS_OFFSET;
  bool bVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint64_t stop;
  uint64_t start;
  CSHA512 to_add;
  bool overwritten [32];
  uint8_t data [32];
  ulong local_140;
  ulong local_138;
  CSHA512 local_130;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar23 = rdtsc();
  uVar23 = uVar23 & 0xffffffff00000000 | CONCAT44((int)((ulong)local_20 >> 0x20),(int)uVar23);
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  uVar24 = 0;
  local_138 = uVar23;
  do {
    local_38 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    anon_unknown.dwarf_17e5ddb::GetOSRand(local_48);
    lVar21 = 0;
    do {
      cVar4 = local_48[lVar21 + 1];
      cVar5 = local_48[lVar21 + 2];
      cVar6 = local_48[lVar21 + 3];
      cVar7 = local_48[lVar21 + 4];
      cVar8 = local_48[lVar21 + 5];
      cVar9 = local_48[lVar21 + 6];
      cVar10 = local_48[lVar21 + 7];
      cVar11 = local_48[lVar21 + 8];
      cVar12 = local_48[lVar21 + 9];
      cVar13 = local_48[lVar21 + 10];
      cVar14 = local_48[lVar21 + 0xb];
      cVar15 = local_48[lVar21 + 0xc];
      cVar16 = local_48[lVar21 + 0xd];
      cVar17 = local_48[lVar21 + 0xe];
      cVar18 = local_48[lVar21 + 0xf];
      local_68[lVar21] = ~-(local_48[lVar21] == '\0') & 1U | local_68[lVar21];
      local_68[lVar21 + 1] = ~-(cVar4 == '\0') & 1U | local_68[lVar21 + 1];
      local_68[lVar21 + 2] = ~-(cVar5 == '\0') & 1U | local_68[lVar21 + 2];
      local_68[lVar21 + 3] = ~-(cVar6 == '\0') & 1U | local_68[lVar21 + 3];
      local_68[lVar21 + 4] = ~-(cVar7 == '\0') & 1U | local_68[lVar21 + 4];
      local_68[lVar21 + 5] = ~-(cVar8 == '\0') & 1U | local_68[lVar21 + 5];
      local_68[lVar21 + 6] = ~-(cVar9 == '\0') & 1U | local_68[lVar21 + 6];
      local_68[lVar21 + 7] = ~-(cVar10 == '\0') & 1U | local_68[lVar21 + 7];
      local_68[lVar21 + 8] = ~-(cVar11 == '\0') & 1U | local_68[lVar21 + 8];
      local_68[lVar21 + 9] = ~-(cVar12 == '\0') & 1U | local_68[lVar21 + 9];
      local_68[lVar21 + 10] = ~-(cVar13 == '\0') & 1U | local_68[lVar21 + 10];
      local_68[lVar21 + 0xb] = ~-(cVar14 == '\0') & 1U | local_68[lVar21 + 0xb];
      local_68[lVar21 + 0xc] = ~-(cVar15 == '\0') & 1U | local_68[lVar21 + 0xc];
      local_68[lVar21 + 0xd] = ~-(cVar16 == '\0') & 1U | local_68[lVar21 + 0xd];
      local_68[lVar21 + 0xe] = ~-(cVar17 == '\0') & 1U | local_68[lVar21 + 0xe];
      local_68[lVar21 + 0xf] = ~-(cVar18 == '\0') & 1U | local_68[lVar21 + 0xf];
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x20);
    iVar26 = 0;
    iVar28 = 0;
    iVar29 = 0;
    iVar30 = 0;
    lVar21 = 0;
    do {
      uVar1 = *(undefined4 *)(local_68 + lVar21);
      auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3._0_12_ = ZEXT812(0);
      uVar19 = CONCAT32(auVar3._10_3_,(ushort)(byte)((uint)uVar1 >> 0x10));
      auVar20._5_8_ = 0;
      auVar20._0_5_ = uVar19;
      iVar26 = iVar26 + (uint)((ushort)uVar1 & 0xff);
      iVar28 = iVar28 + (int)CONCAT72(SUB137(auVar20 << 0x40,6),(ushort)(byte)((uint)uVar1 >> 8));
      iVar29 = iVar29 + (int)uVar19;
      iVar30 = iVar30 + (uint)(uint3)(auVar3._10_3_ >> 0x10);
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x20);
    uVar27 = iVar30 + iVar28 + iVar29 + iVar26;
  } while ((uVar27 < 0x20) && (bVar25 = uVar24 < 0x3ff, uVar24 = uVar24 + 1, bVar25));
  if (uVar27 == 0x20) {
    local_130.s[0] = 0;
    local_130.s[1] = 1000000;
    do {
      iVar26 = nanosleep((timespec *)&local_130,(timespec *)&local_130);
      piVar22 = (int *)CONCAT44(extraout_var,iVar26);
      if (iVar26 != -1) break;
      piVar22 = __errno_location();
    } while (*piVar22 == 4);
    uVar2 = rdtsc();
    local_140 = uVar2 & 0xffffffff00000000 | CONCAT44((int)((ulong)piVar22 >> 0x20),(int)uVar2);
    bVar25 = local_140 != uVar23;
    if (bVar25) {
      CSHA512::CSHA512(&local_130);
      CSHA512::Write(&local_130,(uchar *)&local_138,8);
      CSHA512::Write(&local_130,(uchar *)&local_140,8);
      this = anon_unknown.dwarf_17e5ddb::GetRNGState();
      anon_unknown.dwarf_17e5ddb::RNGState::MixExtract(this,(uchar *)0x0,0,&local_130,false,true);
    }
  }
  else {
    bVar25 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar25;
  }
  __stack_chk_fail();
}

Assistant:

bool Random_SanityCheck()
{
    uint64_t start = GetPerformanceCounter();

    /* This does not measure the quality of randomness, but it does test that
     * GetOSRand() overwrites all 32 bytes of the output given a maximum
     * number of tries.
     */
    static constexpr int MAX_TRIES{1024};
    uint8_t data[NUM_OS_RANDOM_BYTES];
    bool overwritten[NUM_OS_RANDOM_BYTES] = {}; /* Tracks which bytes have been overwritten at least once */
    int num_overwritten;
    int tries = 0;
    /* Loop until all bytes have been overwritten at least once, or max number tries reached */
    do {
        memset(data, 0, NUM_OS_RANDOM_BYTES);
        GetOSRand(data);
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            overwritten[x] |= (data[x] != 0);
        }

        num_overwritten = 0;
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            if (overwritten[x]) {
                num_overwritten += 1;
            }
        }

        tries += 1;
    } while (num_overwritten < NUM_OS_RANDOM_BYTES && tries < MAX_TRIES);
    if (num_overwritten != NUM_OS_RANDOM_BYTES) return false; /* If this failed, bailed out after too many tries */

    // Check that GetPerformanceCounter increases at least during a GetOSRand() call + 1ms sleep.
    std::this_thread::sleep_for(std::chrono::milliseconds(1));
    uint64_t stop = GetPerformanceCounter();
    if (stop == start) return false;

    // We called GetPerformanceCounter. Use it as entropy.
    CSHA512 to_add;
    to_add.Write((const unsigned char*)&start, sizeof(start));
    to_add.Write((const unsigned char*)&stop, sizeof(stop));
    GetRNGState().MixExtract(nullptr, 0, std::move(to_add), false, /*always_use_real_rng=*/true);

    return true;
}